

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SequenceNumber_Test::TestBody
          (SSLVersionTest_SequenceNumber_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer psVar3;
  pointer server;
  SSL *pSVar4;
  char *in_R9;
  AssertHelper local_310;
  Message local_308;
  uint64_t local_300;
  unsigned_long local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_11;
  Message local_2d8;
  uint64_t local_2d0;
  unsigned_long local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_10;
  Message local_2a8;
  int local_2a0;
  int local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_9;
  Message local_280;
  int local_278;
  int local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_8;
  uint8_t byte;
  Message local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_7;
  Message local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_6;
  Message local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_5;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_4;
  Message local_1d0;
  int local_1c8;
  uint16_t local_1c2;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_3;
  Message local_1a8;
  int local_1a0;
  uint16_t local_19a;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_2;
  Message local_180;
  int local_178;
  uint16_t local_172;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_1;
  Message local_158;
  int local_150;
  uint16_t local_14a;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  uint64_t server_write_seq;
  uint64_t server_read_seq;
  uint64_t client_write_seq;
  uint64_t client_read_seq;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__1;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0 [3];
  ClientConfig local_88;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  SSLVersionTest_SequenceNumber_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  bVar1 = SSLVersionTest::is_dtls(&this->super_SSLVersionTest);
  if ((!bVar1) || (bVar1 = SSLVersionTest::is_tls13(&this->super_SSLVersionTest), !bVar1)) {
    local_88.verify_hostname.field_2._M_allocated_capacity = 0;
    local_88.verify_hostname.field_2._8_8_ = 0;
    local_88.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
    local_88.verify_hostname._1_7_ = 0;
    local_88.verify_hostname._M_string_length = 0;
    local_88.servername.field_2._M_allocated_capacity = 0;
    local_88.servername.field_2._8_8_ = 0;
    local_88.servername._M_dataplus = (_Alloc_hider)0x0;
    local_88.servername._1_7_ = 0;
    local_88.servername._M_string_length = 0;
    local_88.session = (SSL_SESSION *)0x0;
    local_88.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
    local_88.hostflags = 0;
    local_88.early_data = false;
    local_88._85_3_ = 0;
    ClientConfig::ClientConfig(&local_88);
    local_21 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_88);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_20,&local_21,(type *)0x0);
    ClientConfig::~ClientConfig(&local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
    if (!bVar1) {
      testing::Message::Message(local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_20,(AssertionResult *)"Connect()","false","true",in_R9)
      ;
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xaf0,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a8,local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      testing::Message::~Message(local_a0);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).client_);
      server = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                         (&(this->super_SSLVersionTest).server_);
      local_e1 = FlushNewSessionTickets(psVar3,server);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_e0,&local_e1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
      if (!bVar1) {
        testing::Message::Message(&local_f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&client_read_seq,(internal *)local_e0,
                   (AssertionResult *)"FlushNewSessionTickets(client_.get(), server_.get())","false"
                   ,"true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xaf4,pcVar2);
        testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        std::__cxx11::string::~string((string *)&client_read_seq);
        testing::Message::~Message(&local_f0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).client_);
        client_write_seq = SSL_get_read_sequence(psVar3);
        psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).client_);
        server_read_seq = SSL_get_write_sequence(psVar3);
        psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).server_);
        server_write_seq = SSL_get_read_sequence(psVar3);
        psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).server_);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )SSL_get_write_sequence(psVar3);
        bVar1 = SSLVersionTest::is_dtls(&this->super_SSLVersionTest);
        if (bVar1) {
          local_14a = EpochFromSequence(client_write_seq);
          local_150 = 1;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_148,"EpochFromSequence(client_read_seq)","1",&local_14a,
                     &local_150);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
          if (!bVar1) {
            testing::Message::Message(&local_158);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xafd,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_1.message_,&local_158);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_158);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
          local_172 = EpochFromSequence(server_read_seq);
          local_178 = 1;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_170,"EpochFromSequence(client_write_seq)","1",&local_172,
                     &local_178);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
          if (!bVar1) {
            testing::Message::Message(&local_180);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xafe,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,&local_180);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_180);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
          local_19a = EpochFromSequence(server_write_seq);
          local_1a0 = 1;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_198,"EpochFromSequence(server_read_seq)","1",&local_19a,
                     &local_1a0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
          if (!bVar1) {
            testing::Message::Message(&local_1a8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xaff,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_3.message_,&local_1a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_1a8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
          local_1c2 = EpochFromSequence((uint64_t)
                                        gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
          local_1c8 = 1;
          testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
                    ((EqHelper *)local_1c0,"EpochFromSequence(server_write_seq)","1",&local_1c2,
                     &local_1c8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
          if (!bVar1) {
            testing::Message::Message(&local_1d0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb00,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_1d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_1d0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
          testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                    ((internal *)local_1e8,"client_write_seq","server_read_seq",&server_read_seq,
                     &server_write_seq);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
          if (!bVar1) {
            testing::Message::Message(&local_1f0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb03,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_1f0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_1f0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
          testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                    ((internal *)local_208,"server_write_seq","client_read_seq",
                     (unsigned_long *)&gtest_ar.message_,&client_write_seq);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
          if (!bVar1) {
            testing::Message::Message(&local_210);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb04,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_210);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_210);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
        }
        else {
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_228,"client_write_seq","server_read_seq",&server_read_seq,
                     &server_write_seq);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
          if (!bVar1) {
            testing::Message::Message(&local_230);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb07,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_230);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_230);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_248,"server_write_seq","client_read_seq",
                     (unsigned_long *)&gtest_ar.message_,&client_write_seq);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
          if (!bVar1) {
            testing::Message::Message(&local_250);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffffda8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xb08,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffffda8,&local_250);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffda8)
            ;
            testing::Message::~Message(&local_250);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
        }
        gtest_ar_8.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._7_1_ = 0;
        pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                  (&(this->super_SSLVersionTest).client_);
        local_274 = SSL_write(pSVar4,(void *)((long)&gtest_ar_8.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             + 7),1);
        local_278 = 1;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_270,"SSL_write(client_.get(), &byte, 1)","1",&local_274,
                   &local_278);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
        if (!bVar1) {
          testing::Message::Message(&local_280);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xb0d,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_9.message_,&local_280);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
          testing::Message::~Message(&local_280);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
        pSVar4 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                  (&(this->super_SSLVersionTest).server_);
        local_29c = SSL_read(pSVar4,(void *)((long)&gtest_ar_8.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            + 7),1);
        local_2a0 = 1;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_298,"SSL_read(server_.get(), &byte, 1)","1",&local_29c,
                   &local_2a0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
        if (!bVar1) {
          testing::Message::Message(&local_2a8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xb0e,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_10.message_,&local_2a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
          testing::Message::~Message(&local_2a8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
        local_2c8 = server_read_seq + 1;
        psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).client_);
        local_2d0 = SSL_get_write_sequence(psVar3);
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_2c0,"client_write_seq + 1",
                   "SSL_get_write_sequence(client_.get())",&local_2c8,&local_2d0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
        if (!bVar1) {
          testing::Message::Message(&local_2d8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xb12,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_11.message_,&local_2d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
          testing::Message::~Message(&local_2d8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
        local_2f8 = server_write_seq + 1;
        psVar3 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                           (&(this->super_SSLVersionTest).server_);
        local_300 = SSL_get_read_sequence(psVar3);
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_2f0,"server_read_seq + 1",
                   "SSL_get_read_sequence(server_.get())",&local_2f8,&local_300);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
        if (!bVar1) {
          testing::Message::Message(&local_308);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_310,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xb13,pcVar2);
          testing::internal::AssertHelper::operator=(&local_310,&local_308);
          testing::internal::AssertHelper::~AssertHelper(&local_310);
          testing::Message::~Message(&local_308);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
      }
    }
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, SequenceNumber) {
  // TODO(crbug.com/42290608): Once |SSL_get_read_sequence| and
  // |SSL_get_write_sequence| are no longer implemented in DTLS 1.3, make this
  // test TLS-only and remove the DTLS cases. For now, since we still care about
  // their behavior in DTLS 1.2, continue testing this behavior.
  if (is_dtls() && is_tls13()) {
    return;
  }

  ASSERT_TRUE(Connect());

  // Drain any post-handshake messages to ensure there are no unread records
  // on either end.
  ASSERT_TRUE(FlushNewSessionTickets(client_.get(), server_.get()));

  uint64_t client_read_seq = SSL_get_read_sequence(client_.get());
  uint64_t client_write_seq = SSL_get_write_sequence(client_.get());
  uint64_t server_read_seq = SSL_get_read_sequence(server_.get());
  uint64_t server_write_seq = SSL_get_write_sequence(server_.get());

  if (is_dtls()) {
    // Both client and server must be at epoch 1.
    EXPECT_EQ(EpochFromSequence(client_read_seq), 1);
    EXPECT_EQ(EpochFromSequence(client_write_seq), 1);
    EXPECT_EQ(EpochFromSequence(server_read_seq), 1);
    EXPECT_EQ(EpochFromSequence(server_write_seq), 1);

    // The next record to be written should exceed the largest received.
    EXPECT_GT(client_write_seq, server_read_seq);
    EXPECT_GT(server_write_seq, client_read_seq);
  } else {
    // The next record to be written should equal the next to be received.
    EXPECT_EQ(client_write_seq, server_read_seq);
    EXPECT_EQ(server_write_seq, client_read_seq);
  }

  // Send a record from client to server.
  uint8_t byte = 0;
  EXPECT_EQ(SSL_write(client_.get(), &byte, 1), 1);
  EXPECT_EQ(SSL_read(server_.get(), &byte, 1), 1);

  // The client write and server read sequence numbers should have
  // incremented.
  EXPECT_EQ(client_write_seq + 1, SSL_get_write_sequence(client_.get()));
  EXPECT_EQ(server_read_seq + 1, SSL_get_read_sequence(server_.get()));
}